

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

void __thiscall PEFile::PEFile(PEFile *this,AbstractByteBuffer *v_buf)

{
  AbstractByteBuffer *v_buf_local;
  PEFile *this_local;
  
  MappedExe::MappedExe(&this->super_MappedExe,v_buf,BITS_32);
  (this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer =
       (_func_int **)&PTR__PEFile_0018dfb8;
  (this->super_MappedExe).super_ExeWrappersContainer._vptr_ExeWrappersContainer =
       (_func_int **)&PTR__PEFile_0018e0d8;
  PECore::PECore(&this->core);
  this->dosHdrWrapper = (DosHdrWrapper *)0x0;
  this->fHdr = (FileHdrWrapper *)0x0;
  this->optHdr = (OptHdrWrapper *)0x0;
  this->sects = (SectHdrsWrapper *)0x0;
  this->album = (ResourcesAlbum *)0x0;
  QMutex::QMutex(&this->m_peMutex);
  (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x21]
  )();
  _init(this,v_buf);
  Logger::append(D_INFO,"Wrapped");
  return;
}

Assistant:

PEFile::PEFile(AbstractByteBuffer *v_buf)
    : MappedExe(v_buf, Executable::BITS_32), 
    dosHdrWrapper(NULL), fHdr(NULL), optHdr(NULL), sects(NULL),
    album(NULL)
{
    clearWrappers();

    _init(v_buf);
    Logger::append(Logger::D_INFO,"Wrapped");
}